

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerGLSL::emit_hoisted_temporaries
          (CompilerGLSL *this,
          SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>,_8UL>
          *temporaries)

{
  uint uVar1;
  ulong uVar2;
  pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
  pVar3;
  size_t sVar4;
  long lVar5;
  uint32_t id;
  TypedID<(spirv_cross::Types)0> *pTVar6;
  bool bVar7;
  SPIRType *type;
  mapped_type *name;
  Bitset *pBVar8;
  iterator iVar9;
  TypedID<(spirv_cross::Types)0> TVar10;
  TypedID<(spirv_cross::Types)0> *pTVar11;
  pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
  *ppVar12;
  uint uVar13;
  TypedID<(spirv_cross::Types)0> *pTVar14;
  pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
  *__i;
  pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
  *ppVar15;
  pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
  *ppVar16;
  uint32_t mirror_id;
  string initializer;
  __hashtable *__h;
  __hashtable *__h_1;
  uint32_t local_ec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  undefined1 local_c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_88;
  undefined1 *local_80 [2];
  undefined1 local_70 [16];
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_60;
  _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_58;
  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_50;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_48;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_40;
  long local_38;
  
  uVar2 = (temporaries->
          super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
          ).buffer_size;
  if (uVar2 != 0) {
    ppVar12 = (temporaries->
              super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
              ).ptr;
    ppVar16 = ppVar12 + uVar2;
    lVar5 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar2 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    ::std::
    __introsort_loop<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>*,long,__gnu_cxx::__ops::_Iter_comp_iter<spirv_cross::CompilerGLSL::emit_hoisted_temporaries(spirv_cross::SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>,8ul>&)::__0>>
              (ppVar12,ppVar16,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)uVar2 < 0x11) {
      ::std::
      __insertion_sort<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>*,__gnu_cxx::__ops::_Iter_comp_iter<spirv_cross::CompilerGLSL::emit_hoisted_temporaries(spirv_cross::SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>,8ul>&)::__0>>
                (ppVar12,ppVar16);
    }
    else {
      ppVar15 = ppVar12 + 0x10;
      ::std::
      __insertion_sort<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>*,__gnu_cxx::__ops::_Iter_comp_iter<spirv_cross::CompilerGLSL::emit_hoisted_temporaries(spirv_cross::SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>,8ul>&)::__0>>
                (ppVar12,ppVar15);
      pTVar14 = &ppVar12[0x10].second;
      do {
        pVar3 = *ppVar15;
        uVar13 = ppVar15[-1].second.id;
        TVar10 = pVar3.second.id;
        ppVar12 = ppVar15;
        pTVar6 = pTVar14;
        if (TVar10.id < uVar13) {
          do {
            pTVar11 = pTVar6;
            uVar1 = pTVar11[-4].id;
            (((pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
               *)(pTVar11 + -1))->first).id = pTVar11[-3].id;
            pTVar11->id = uVar13;
            pTVar6 = pTVar11 + -2;
            uVar13 = uVar1;
          } while (TVar10.id < uVar1);
          ppVar12 = (pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
                     *)(pTVar11 + -3);
        }
        (ppVar12->first).id = pVar3.first.id.id;
        (ppVar12->second).id = TVar10.id;
        ppVar15 = ppVar15 + 1;
        pTVar14 = pTVar14 + 2;
      } while (ppVar15 != ppVar16);
    }
    sVar4 = (temporaries->
            super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
            ).buffer_size;
    if (sVar4 != 0) {
      ppVar16 = (temporaries->
                super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
                ).ptr;
      local_40 = &this->local_variable_names;
      local_48 = &this->block_names;
      local_50 = (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  *)&(this->super_Compiler).ir.meta;
      local_88 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&(this->super_Compiler).hoisted_temporaries;
      local_58 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&(this->super_Compiler).forced_temporaries;
      local_60 = &(this->temporary_to_mirror_precision_alias)._M_h;
      local_38 = sVar4 << 3;
      do {
        type = Variant::get<spirv_cross::SPIRType>
                         ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                          (ppVar16->first).id);
        if ((type->pointer != true) || ((this->backend).native_pointers == true)) {
          local_a8._M_dataplus._M_p._0_4_ = (ppVar16->second).id;
          name = ::std::__detail::
                 _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[](local_50,(key_type *)&local_a8);
          add_variable(this,local_40,local_48,(string *)name);
          pBVar8 = Compiler::get_decoration_bitset(&this->super_Compiler,(ID)(ppVar16->second).id);
          local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
          local_a8._M_string_length = 0;
          local_a8.field_2._M_local_buf[0] = '\0';
          if (((this->options).force_zero_initialized_variables == true) &&
             (bVar7 = type_can_zero_initialize(this,type), bVar7)) {
            (*(this->super_Compiler)._vptr_Compiler[0x3a])
                      (&local_e8,this,(ulong)(ppVar16->first).id);
            join<char_const(&)[4],std::__cxx11::string>
                      ((string *)local_c8,(spirv_cross *)0x303a1d,(char (*) [4])&local_e8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)name);
            ::std::__cxx11::string::operator=((string *)&local_a8,(string *)local_c8);
            if ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                 *)local_c8._0_8_ !=
                (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                 *)(local_c8 + 0x10)) {
              operator_delete((void *)local_c8._0_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_e8._M_dataplus._M_p._4_4_,(uint32_t)local_e8._M_dataplus._M_p) !=
                &local_e8.field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(local_e8._M_dataplus._M_p._4_4_,
                                       (uint32_t)local_e8._M_dataplus._M_p));
            }
          }
          flags_to_qualifiers_glsl_abi_cxx11_((string *)local_c8,this,type,pBVar8);
          (*(this->super_Compiler)._vptr_Compiler[6])(local_80,this,(ulong)(ppVar16->second).id,1);
          (*(this->super_Compiler)._vptr_Compiler[0x1b])(&local_e8,this,type,local_80,0);
          statement<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string&,char_const(&)[2]>
                    (this,(string *)local_c8,&local_e8,&local_a8,(char (*) [2])0x30eb86);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_e8._M_dataplus._M_p._4_4_,(uint32_t)local_e8._M_dataplus._M_p) !=
              &local_e8.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_e8._M_dataplus._M_p._4_4_,
                                     (uint32_t)local_e8._M_dataplus._M_p));
          }
          if (local_80[0] != local_70) {
            operator_delete(local_80[0]);
          }
          if ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
               *)local_c8._0_8_ !=
              (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
               *)(local_c8 + 0x10)) {
            operator_delete((void *)local_c8._0_8_);
          }
          local_e8._M_dataplus._M_p._0_4_ = (ppVar16->second).id;
          local_c8._0_8_ = local_88;
          ::std::
          _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                    (local_88,&local_e8,(string *)local_c8);
          local_e8._M_dataplus._M_p._0_4_ = (ppVar16->second).id;
          local_c8._0_8_ = local_58;
          ::std::
          _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                    (local_58,&local_e8,(string *)local_c8);
          uVar13 = (ppVar16->second).id;
          (*(this->super_Compiler)._vptr_Compiler[6])((string *)local_c8,this,(ulong)uVar13,1);
          local_e8._M_dataplus._M_p._0_4_ = CONCAT31(local_e8._M_dataplus._M_p._1_3_,1);
          Compiler::
          set<spirv_cross::SPIRExpression,std::__cxx11::string,spirv_cross::TypedID<(spirv_cross::Types)1>&,bool>
                    (&this->super_Compiler,uVar13,(string *)local_c8,&ppVar16->first,
                     (bool *)&local_e8);
          if ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
               *)local_c8._0_8_ !=
              (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
               *)(local_c8 + 0x10)) {
            operator_delete((void *)local_c8._0_8_);
          }
          local_c8._0_4_ = (ppVar16->second).id;
          iVar9 = ::std::
                  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(local_60,(key_type_conflict *)local_c8);
          if (iVar9.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
              _M_cur != (__node_type *)0x0) {
            local_ec = *(uint32_t *)
                        ((long)iVar9.
                               super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                               ._M_cur + 0xc);
            pBVar8 = Compiler::get_decoration_bitset(&this->super_Compiler,(ID)local_ec);
            flags_to_qualifiers_glsl_abi_cxx11_((string *)local_c8,this,type,pBVar8);
            (*(this->super_Compiler)._vptr_Compiler[6])(local_80,this,(ulong)local_ec,1);
            (*(this->super_Compiler)._vptr_Compiler[0x1b])(&local_e8,this,type,local_80,0);
            statement<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string&,char_const(&)[2]>
                      (this,(string *)local_c8,&local_e8,&local_a8,(char (*) [2])0x30eb86);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_e8._M_dataplus._M_p._4_4_,(uint32_t)local_e8._M_dataplus._M_p) !=
                &local_e8.field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(local_e8._M_dataplus._M_p._4_4_,
                                       (uint32_t)local_e8._M_dataplus._M_p));
            }
            if (local_80[0] != local_70) {
              operator_delete(local_80[0]);
            }
            if ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                 *)local_c8._0_8_ !=
                (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                 *)(local_c8 + 0x10)) {
              operator_delete((void *)local_c8._0_8_);
            }
            id = local_ec;
            (*(this->super_Compiler)._vptr_Compiler[6])((string *)local_c8,this,(ulong)local_ec,1);
            local_e8._M_dataplus._M_p._0_4_ = CONCAT31(local_e8._M_dataplus._M_p._1_3_,1);
            Compiler::
            set<spirv_cross::SPIRExpression,std::__cxx11::string,spirv_cross::TypedID<(spirv_cross::Types)1>&,bool>
                      (&this->super_Compiler,id,(string *)local_c8,&ppVar16->first,(bool *)&local_e8
                      );
            if ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                 *)local_c8._0_8_ !=
                (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                 *)(local_c8 + 0x10)) {
              operator_delete((void *)local_c8._0_8_);
            }
            local_c8._0_8_ = local_88;
            ::std::
            _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                      (local_88,&local_ec,(string *)local_c8);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p);
          }
        }
        ppVar16 = ppVar16 + 1;
        local_38 = local_38 + -8;
      } while (local_38 != 0);
    }
  }
  return;
}

Assistant:

static bool packing_is_scalar(BufferPackingStandard packing)
{
	switch (packing)
	{
	case BufferPackingScalar:
	case BufferPackingScalarEnhancedLayout:
		return true;

	default:
		return false;
	}
}